

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O3

int run_test_udp_connect(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int extraout_EAX_01;
  uv_loop_t *puVar3;
  bool bVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  uv_udp_recv_cb p_Var6;
  uv_handle_t *puVar7;
  uv_udp_t *puVar8;
  uv_udp_send_t *req_00;
  int64_t eval_b_8;
  int64_t eval_b_22;
  sockaddr_in ext_addr;
  int addrlen;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  code *pcStack_1e8;
  undefined8 uStack_1d8;
  uv_close_cb p_Stack_1d0;
  uv_loop_t *puStack_1c8;
  uv_handle_t *puStack_1b8;
  undefined1 auStack_1b0 [32];
  uv_udp_recv_cb p_Stack_190;
  undefined1 local_188 [8];
  uv_loop_t *local_180;
  uv__queue *local_178 [2];
  int local_164;
  sockaddr_in local_160;
  uv_udp_send_t local_150;
  long lVar5;
  
  puVar8 = (uv_udp_t *)local_188;
  p_Stack_190 = (uv_udp_recv_cb)0x1d67c8;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  local_150.data = (void *)(long)iVar1;
  local_178[0] = (uv__queue *)0x0;
  if ((uv__queue *)local_150.data == (uv__queue *)0x0) {
    p_Stack_190 = (uv_udp_recv_cb)0x1d67ed;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d67fc;
    iVar1 = uv_udp_init(puVar3,&server);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e18;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6831;
    iVar1 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e27;
    p_Stack_190 = (uv_udp_recv_cb)0x1d686b;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e36;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6890;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d689f;
    iVar1 = uv_udp_init(puVar3,&client);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e45;
    p_Stack_190 = (uv_udp_recv_cb)0x1d68d0;
    buf = uv_buf_init("EXIT",4);
    p_Stack_190 = (uv_udp_recv_cb)0x1d68f4;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&local_160);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e54;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6925;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&local_160);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e63;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6953;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_178[0] = (uv__queue *)0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e72;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6989;
    iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,(sockaddr_in *)local_178);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e81;
    p_Stack_190 = (uv_udp_recv_cb)0x1d69bf;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e8e;
    p_Stack_190 = (uv_udp_recv_cb)0x1d69f0;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6e9b;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a1f;
    iVar1 = uv_udp_connect(&client,(sockaddr *)local_178);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff96;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff96) goto LAB_001d6ea8;
    local_164 = 0x10;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a59;
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)&local_160,&local_164);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6eb5;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6a96;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff96;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff96) goto LAB_001d6ec2;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ace;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    local_150.data = (uv__queue *)0x4;
    local_188 = (undefined1  [8])(long)iVar1;
    if (local_188 != (undefined1  [8])0x4) goto LAB_001d6ecf;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6b09;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)local_178);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff96;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff96) goto LAB_001d6edc;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6b35;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6ee9;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6b61;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff95;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff95) goto LAB_001d6ef6;
    local_164 = 0x10;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6b9b;
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)&local_160,&local_164);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffff95;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffff95) goto LAB_001d6f03;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6bd8;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    local_150.data = (uv__queue *)0x4;
    local_188 = (undefined1  [8])(long)iVar1;
    if (local_188 != (undefined1  [8])0x4) goto LAB_001d6f10;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6c10;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0xffffffffffffffa7;
    if ((uv__queue *)local_150.data != (uv__queue *)0xffffffffffffffa7) goto LAB_001d6f1d;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6c41;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    local_150.data = (void *)(long)iVar1;
    local_188 = (undefined1  [8])0x0;
    if ((uv__queue *)local_150.data != (uv__queue *)0x0) goto LAB_001d6f2a;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6c8a;
    iVar1 = uv_udp_send(&local_150,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
    local_188 = (undefined1  [8])(long)iVar1;
    local_180 = (uv_loop_t *)0xffffffffffffff96;
    if (local_188 != (undefined1  [8])0xffffffffffffff96) goto LAB_001d6f37;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ccf;
    iVar1 = uv_udp_send(&local_150,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    local_188 = (undefined1  [8])(long)iVar1;
    local_180 = (uv_loop_t *)0x0;
    if (local_188 != (undefined1  [8])0x0) goto LAB_001d6f44;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6cf2;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6cfc;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_188 = (undefined1  [8])0x2;
    local_180 = (uv_loop_t *)(long)close_cb_called;
    if (local_180 != (uv_loop_t *)0x2) goto LAB_001d6f51;
    local_188 = (undefined1  [8])0x4;
    local_180 = (uv_loop_t *)(long)sv_recv_cb_called;
    if (local_180 != (uv_loop_t *)0x4) goto LAB_001d6f5e;
    local_188 = (undefined1  [8])0x2;
    local_180 = (uv_loop_t *)(long)cl_send_cb_called;
    if (local_180 != (uv_loop_t *)0x2) goto LAB_001d6f6b;
    local_188 = (undefined1  [8])client.send_queue_size;
    local_180 = (uv_loop_t *)0x0;
    if (client.send_queue_size != 0) goto LAB_001d6f78;
    local_188 = (undefined1  [8])server.send_queue_size;
    local_180 = (uv_loop_t *)0x0;
    if (server.send_queue_size != 0) goto LAB_001d6f85;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6db0;
    unaff_RBX = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6dc4;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    p_Stack_190 = (uv_udp_recv_cb)0x1d6dce;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_188 = (undefined1  [8])0x0;
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ddb;
    puVar3 = uv_default_loop();
    p_Stack_190 = (uv_udp_recv_cb)0x1d6de3;
    iVar1 = uv_loop_close(puVar3);
    local_180 = (uv_loop_t *)(long)iVar1;
    if (local_188 == (undefined1  [8])local_180) {
      p_Stack_190 = (uv_udp_recv_cb)0x1d6dfe;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e18;
    run_test_udp_connect_cold_1();
LAB_001d6e18:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e27;
    run_test_udp_connect_cold_2();
LAB_001d6e27:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e36;
    run_test_udp_connect_cold_3();
LAB_001d6e36:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e45;
    run_test_udp_connect_cold_4();
LAB_001d6e45:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e54;
    run_test_udp_connect_cold_5();
LAB_001d6e54:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e63;
    run_test_udp_connect_cold_6();
LAB_001d6e63:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e72;
    run_test_udp_connect_cold_7();
LAB_001d6e72:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e81;
    run_test_udp_connect_cold_8();
LAB_001d6e81:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e8e;
    run_test_udp_connect_cold_9();
LAB_001d6e8e:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6e9b;
    run_test_udp_connect_cold_10();
LAB_001d6e9b:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ea8;
    run_test_udp_connect_cold_11();
LAB_001d6ea8:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6eb5;
    run_test_udp_connect_cold_12();
LAB_001d6eb5:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ec2;
    run_test_udp_connect_cold_13();
LAB_001d6ec2:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ecf;
    run_test_udp_connect_cold_14();
LAB_001d6ecf:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6edc;
    run_test_udp_connect_cold_15();
LAB_001d6edc:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ee9;
    run_test_udp_connect_cold_16();
LAB_001d6ee9:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6ef6;
    run_test_udp_connect_cold_17();
LAB_001d6ef6:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f03;
    run_test_udp_connect_cold_18();
LAB_001d6f03:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f10;
    run_test_udp_connect_cold_19();
LAB_001d6f10:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f1d;
    run_test_udp_connect_cold_20();
LAB_001d6f1d:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f2a;
    run_test_udp_connect_cold_21();
LAB_001d6f2a:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f37;
    run_test_udp_connect_cold_22();
LAB_001d6f37:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f44;
    run_test_udp_connect_cold_23();
LAB_001d6f44:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f51;
    run_test_udp_connect_cold_24();
LAB_001d6f51:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f5e;
    run_test_udp_connect_cold_25();
LAB_001d6f5e:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f6b;
    run_test_udp_connect_cold_26();
LAB_001d6f6b:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f78;
    run_test_udp_connect_cold_27();
LAB_001d6f78:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f85;
    run_test_udp_connect_cold_28();
LAB_001d6f85:
    p_Stack_190 = (uv_udp_recv_cb)0x1d6f92;
    run_test_udp_connect_cold_29();
  }
  p_Var6 = (uv_udp_recv_cb)(local_188 + 8);
  p_Stack_190 = alloc_cb;
  run_test_udp_connect_cold_30();
  bVar4 = puVar8 == &client || puVar8 == &server;
  lVar5 = CONCAT71(0xfb6e,bVar4);
  p_Stack_190 = (uv_udp_recv_cb)(ulong)bVar4;
  auStack_1b0._24_8_ = (uv_alloc_cb)0x0;
  if (p_Stack_190 == (uv_udp_recv_cb)0x0) {
    auStack_1b0._8_8_ = (uv_loop_t *)0x1d701c;
    alloc_cb_cold_2();
  }
  else {
    auStack_1b0._24_8_ = (uv_alloc_cb)0x10000;
    p_Stack_190 = p_Var6;
    if ((long)p_Var6 < 0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return 0xfb6f60;
    }
  }
  puVar7 = (uv_handle_t *)(auStack_1b0 + 0x18);
  auStack_1b0._8_8_ = sv_recv_cb;
  alloc_cb_cold_1();
  iVar2 = (int)&puStack_1b8;
  iVar1 = extraout_EAX;
  if ((long)puVar7 < 1) {
LAB_001d70c2:
    return iVar1;
  }
  auStack_1b0._0_8_ = (uv__queue *)0x4;
  puStack_1b8 = puVar7;
  auStack_1b0._8_8_ = unaff_RBX;
  if (puVar7 == (uv_handle_t *)0x4) {
    if (lVar5 == 0) goto LAB_001d70d5;
    iVar1 = memcmp("EXIT",(void *)*extraout_RDX_00,4);
    auStack_1b0._0_8_ = SEXT48(iVar1);
    puStack_1b8 = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_1b0._0_8_ == (uv__queue *)0x0) {
      iVar1 = sv_recv_cb_called + 1;
      sv_recv_cb_called = iVar1;
      if (iVar1 == 4) {
        uv_close((uv_handle_t *)&server,close_cb);
        uv_close((uv_handle_t *)&client,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_001d70c2;
    }
  }
  else {
    sv_recv_cb_cold_1();
LAB_001d70d5:
    sv_recv_cb_cold_3();
  }
  req_00 = (uv_udp_send_t *)auStack_1b0;
  sv_recv_cb_cold_2();
  puStack_1c8 = unaff_RBX;
  if (req_00 == (uv_udp_send_t *)0x0) {
    pcStack_1e8 = (code *)0x1d7213;
    cl_send_cb_cold_5();
LAB_001d7213:
    pcStack_1e8 = (code *)0x1d7222;
    cl_send_cb_cold_1();
LAB_001d7222:
    pcStack_1e8 = (code *)0x1d7231;
    cl_send_cb_cold_4();
  }
  else {
    p_Stack_1d0 = (uv_close_cb)(long)iVar2;
    uStack_1d8._0_4_ = UV_UNKNOWN_HANDLE;
    uStack_1d8._4_4_ = 0;
    if (p_Stack_1d0 != (uv_close_cb)0x0) goto LAB_001d7213;
    p_Stack_1d0 = (uv_close_cb)(ulong)(req_00->handle == &client || req_00->handle == &server);
    uStack_1d8._0_4_ = UV_UNKNOWN_HANDLE;
    uStack_1d8._4_4_ = 0;
    if (p_Stack_1d0 == (uv_close_cb)0x0) goto LAB_001d7222;
    iVar1 = cl_send_cb_called + 1;
    iVar2 = cl_send_cb_called;
    if (cl_send_cb_called != 0) {
LAB_001d7206:
      cl_send_cb_called = iVar1;
      return iVar2;
    }
    pcStack_1e8 = (code *)0x1d7184;
    cl_send_cb_called = cl_send_cb_called + 1;
    uv_udp_connect(&client,(sockaddr *)0x0);
    pcStack_1e8 = (code *)0x1d71a5;
    iVar1 = uv_udp_send(req_00,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    p_Stack_1d0 = (uv_close_cb)(long)iVar1;
    uStack_1d8._0_4_ = 0xffffffa7;
    uStack_1d8._4_4_ = 0xffffffff;
    if (p_Stack_1d0 == (uv_close_cb)0xffffffffffffffa7) {
      pcStack_1e8 = (code *)0x1d71ea;
      iVar2 = uv_udp_send(req_00,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
      p_Stack_1d0 = (uv_close_cb)(long)iVar2;
      uStack_1d8._0_4_ = UV_UNKNOWN_HANDLE;
      uStack_1d8._4_4_ = 0;
      iVar1 = cl_send_cb_called;
      if (p_Stack_1d0 == (uv_close_cb)0x0) goto LAB_001d7206;
      goto LAB_001d7240;
    }
  }
  pcStack_1e8 = (code *)0x1d7240;
  cl_send_cb_cold_2();
LAB_001d7240:
  puVar8 = (uv_udp_t *)&p_Stack_1d0;
  pcStack_1e8 = close_cb;
  cl_send_cb_cold_3();
  pcStack_1e8 = (code *)(ulong)(puVar8 == &client || puVar8 == &server);
  if (pcStack_1e8 == (code *)0x0) {
    puVar8 = (uv_udp_t *)&pcStack_1e8;
    close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_closing((uv_handle_t *)puVar8);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return iVar1;
    }
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar8);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar8,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows with WSAEADDRNOTAVAIL */
  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
#endif

  ASSERT_OK(uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_OK(r);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT_EQ(r, UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT_OK(r);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT_EQ(r, UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT_EQ(4, r);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT_EQ(r, UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT_OK(r);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT_EQ(r, UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(4, sv_recv_cb_called);
  ASSERT_EQ(2, cl_send_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}